

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

int __thiscall tcu::abs(tcu *this,int __x)

{
  undefined4 in_register_00000034;
  Interval *arg0;
  Interval mono;
  Interval local_28;
  
  arg0 = (Interval *)CONCAT44(in_register_00000034,__x);
  applyMonotone(&local_28,std::abs,arg0);
  if ((0.0 < arg0->m_lo) || (arg0->m_hi < 0.0)) {
    *(double *)(this + 0x10) = local_28.m_hi;
    *(ulong *)this = CONCAT71(local_28._1_7_,local_28.m_hasNaN);
    *(double *)(this + 8) = local_28.m_lo;
  }
  else {
    *this = (tcu)local_28.m_hasNaN;
    *(ulong *)(this + 8) = -(ulong)(local_28.m_lo < 0.0) & (ulong)local_28.m_lo;
    *(ulong *)(this + 0x10) = -(ulong)(0.0 < local_28.m_hi) & (ulong)local_28.m_hi;
  }
  return (int)this;
}

Assistant:

Interval abs (const Interval& x)
{
	const Interval mono = applyMonotone(std::abs, x);

	if (x.contains(0.0))
		return Interval(0.0, mono);

	return mono;
}